

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ResizeBilinearLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_resizebilinear
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ResizeBilinearLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_resizebilinear(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_resizebilinear(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ResizeBilinearLayerParams>(arena);
    (this->layer_).resizebilinear_ = pRVar2;
  }
  return (ResizeBilinearLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ResizeBilinearLayerParams* NeuralNetworkLayer::_internal_mutable_resizebilinear() {
  if (!_internal_has_resizebilinear()) {
    clear_layer();
    set_has_resizebilinear();
    layer_.resizebilinear_ = CreateMaybeMessage< ::CoreML::Specification::ResizeBilinearLayerParams >(GetArenaForAllocation());
  }
  return layer_.resizebilinear_;
}